

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInWitnessUtxoDirect(Psbt *this,uint32_t index,TxOutReference *txout)

{
  pointer *__return_storage_ptr__;
  void *pvVar1;
  int64_t iVar2;
  uchar *puVar3;
  size_type sVar4;
  CfdException *pCVar5;
  Amount AVar6;
  allocator local_141;
  string local_140;
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  CfdSourceLocation local_e0;
  int64_t local_c8;
  undefined1 local_c0;
  Amount local_b8;
  int local_a8 [2];
  int ret;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script;
  wally_tx_output *output;
  wally_psbt *psbt_pointer;
  TxOutReference *txout_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x92a,"SetTxInWitnessUtxoDirect");
  pvVar1 = this->wally_psbt_pointer_;
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__ =
       &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  AbstractTxOutReference::GetLockingScript
            ((Script *)__return_storage_ptr__,&txout->super_AbstractTxOutReference);
  Script::GetData(&local_98,(Script *)__return_storage_ptr__);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,&local_98);
  ByteData::~ByteData(&local_98);
  AVar6 = AbstractTxOutReference::GetValue(&txout->super_AbstractTxOutReference);
  local_c8 = AVar6.amount_;
  local_c0 = AVar6.ignore_check_;
  local_b8.amount_ = local_c8;
  local_b8.ignore_check_ = (bool)local_c0;
  iVar2 = Amount::GetSatoshiValue(&local_b8);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  local_a8[0] = wally_tx_output_init_alloc
                          (iVar2,puVar3,sVar4,
                           &script.script_stack_.
                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_a8[0] != 0) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x935;
    local_e0.funcname = "SetTxInWitnessUtxoDirect";
    logger::warn<int&>(&local_e0,"wally_tx_output_init_alloc NG[{}]",local_a8);
    local_102 = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_100,"psbt alloc output error.",&local_101);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_100);
    local_102 = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a8[0] = wally_psbt_input_set_witness_utxo
                          (*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110,
                           script.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  wally_tx_output_free
            (script.script_stack_.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_a8[0] != 0) {
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x93d;
    local_120.funcname = "SetTxInWitnessUtxoDirect";
    logger::warn<int&>(&local_120,"wally_psbt_input_set_witness_utxo NG[{}]",local_a8);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_140,"psbt add witness utxo error.",&local_141);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_140);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  Script::~Script((Script *)
                  &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Psbt::SetTxInWitnessUtxoDirect(
    uint32_t index, const TxOutReference &txout) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *output = nullptr;
  auto script = txout.GetLockingScript();
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }
}